

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcompleter.cpp
# Opt level: O0

int __thiscall QCompleterPrivate::init(QCompleterPrivate *this,EVP_PKEY_CTX *ctx)

{
  QAbstractItemModel *model;
  QCompletionModel *pQVar1;
  long in_FS_OFFSET;
  QCompleter *q;
  QCompleterPrivate *in_stack_ffffffffffffffc8;
  QObject *this_00;
  CompletionMode mode;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  undefined4 uVar2;
  QObject local_10 [8];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  model = (QAbstractItemModel *)q_func(this);
  pQVar1 = (QCompletionModel *)operator_new(0x28);
  QCompletionModel::QCompletionModel
            ((QCompletionModel *)CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
             in_stack_ffffffffffffffc8,(QObject *)this);
  this->proxy = pQVar1;
  this_00 = local_10;
  uVar2 = 0;
  QObject::connect(this_00,(char *)this->proxy,(QObject *)"2rowsAdded()",(char *)model,0xb4b554);
  QMetaObject::Connection::~Connection((Connection *)this_00);
  mode = (CompletionMode)((ulong)this_00 >> 0x20);
  QCompleter::setModel((QCompleter *)ctx,model);
  QCompleter::setCompletionMode((QCompleter *)CONCAT44(uVar2,in_stack_ffffffffffffffd0),mode);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QCompleterPrivate::init(QAbstractItemModel *m)
{
    Q_Q(QCompleter);
    proxy = new QCompletionModel(this, q);
    QObject::connect(proxy, SIGNAL(rowsAdded()), q, SLOT(_q_autoResizePopup()));
    q->setModel(m);
#if !QT_CONFIG(listview)
    q->setCompletionMode(QCompleter::InlineCompletion);
#else
    q->setCompletionMode(QCompleter::PopupCompletion);
#endif // QT_CONFIG(listview)
}